

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

uint32 __thiscall Js::FunctionBody::GetEndNonTempLocalIndex(FunctionBody *this)

{
  uint32 uVar1;
  uint32 uVar2;
  
  uVar1 = 0xffffffff;
  if ((this->field_0x17d & 1) != 0) {
    uVar1 = GetCountField(this,FirstTmpRegister);
  }
  if (uVar1 == 0xffffffff) {
    uVar2 = GetCountField(this,ConstantCount);
    uVar1 = GetCountField(this,VarCount);
    uVar1 = uVar1 + uVar2;
  }
  return uVar1;
}

Assistant:

uint32
    FunctionBody::GetEndNonTempLocalIndex()
    {
        // It will give the index on which current non temp locals ends, which is a first temp reg.
        RegSlot firstTmpReg = GetFirstTmpRegister();
        return firstTmpReg != Constants::NoRegister ? firstTmpReg : GetLocalsCount();
    }